

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll_set.cpp
# Opt level: O0

bool __thiscall
miniros::PollSet::addSocket
          (PollSet *this,int fd,SocketUpdateFunc *update_func,TransportPtr *transport)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_int,_miniros::PollSet::SocketInfo>_> name;
  byte bVar2;
  __sighandler_t __handler;
  int in_ESI;
  int __sig;
  void *pvVar3;
  PollSet *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_SocketInfo>_>::value,_pair<iterator,_bool>_>
  _Var4;
  bool enabled;
  bool b;
  scoped_lock<std::mutex> lock;
  SocketInfo info;
  mutex_type *in_stack_fffffffffffffea8;
  Level level;
  int in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  pair<int,_miniros::PollSet::SocketInfo> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  function<void_(int)> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed4;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar5;
  PollSet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_101;
  string local_100 [32];
  _Base_ptr local_e0;
  undefined1 local_d8;
  undefined1 local_d0 [64];
  _Base_ptr local_90;
  undefined1 local_88;
  byte local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_30;
  undefined4 local_2c;
  int local_14;
  byte local_1;
  
  this_01 = &local_60;
  local_14 = in_ESI;
  SocketInfo::SocketInfo
            ((SocketInfo *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  local_30 = local_14;
  local_2c = 0;
  std::shared_ptr<miniros::Transport>::operator=
            ((shared_ptr<miniros::Transport> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (shared_ptr<miniros::Transport> *)in_stack_fffffffffffffea8);
  std::function<void_(int)>::operator=
            ((function<void_(int)> *)
             CONCAT17(in_stack_fffffffffffffed7,
                      CONCAT16(in_stack_fffffffffffffed6,
                               CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0))),
             in_stack_fffffffffffffec8);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
            );
  level = (Level)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  this_00 = in_RDI;
  std::make_pair<int&,miniros::PollSet::SocketInfo&>
            (&in_stack_fffffffffffffeb8->first,
             (SocketInfo *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  __sig = (int)local_d0;
  _Var4 = std::
          map<int,miniros::PollSet::SocketInfo,std::less<int>,std::allocator<std::pair<int_const,miniros::PollSet::SocketInfo>>>
          ::insert<std::pair<int,miniros::PollSet::SocketInfo>>
                    ((map<int,_miniros::PollSet::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_miniros::PollSet::SocketInfo>_>_>
                      *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffeb8);
  name = _Var4.first._M_node;
  bVar2 = _Var4.second;
  uVar5 = bVar2;
  local_e0 = name._M_node;
  local_d8 = bVar2;
  local_90 = name._M_node;
  local_88 = bVar2;
  std::pair<int,_miniros::PollSet::SocketInfo>::~pair
            ((pair<int,_miniros::PollSet::SocketInfo> *)0x48440d);
  local_79 = bVar2 & 1;
  if (local_79 == 0) {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((addSocket::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)this_00,(allocator<char> *)in_RDI);
      __sig = (int)local_100;
      console::initializeLogLocation
                ((LogLocation *)in_RDI,(string *)name._M_node,
                 CONCAT13(uVar5,CONCAT12(bVar2,in_stack_fffffffffffffed4)));
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    if (addSocket::loc.level_ != Debug) {
      __sig = 0;
      console::setLogLocationLevel
                ((LogLocation *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),level)
      ;
      console::checkLogLocationEnabled
                ((LogLocation *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    }
    if ((addSocket::loc.logger_enabled_ & 1U) != 0) {
      pvVar3 = addSocket::loc.logger_;
      console::print((FilterBase *)0x0,addSocket::loc.logger_,(Level)(ulong)addSocket::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/poll_set.cpp"
                     ,0x52,
                     "bool miniros::PollSet::addSocket(int, const SocketUpdateFunc &, const TransportPtr &)"
                     ,"PollSet: Tried to add duplicate fd [%d]");
      __sig = (int)pvVar3;
      in_stack_fffffffffffffeb0 = local_14;
    }
    local_1 = 0;
    bVar1 = true;
  }
  else {
    __sig = local_14;
    add_socket_to_watcher(this_00->epfd_,local_14);
    this_00->sockets_changed_ = true;
    bVar1 = false;
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x48462b);
  if (!bVar1) {
    signal(this_00,__sig,__handler);
    local_1 = 1;
  }
  SocketInfo::~SocketInfo
            ((SocketInfo *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  return (bool)(local_1 & 1);
}

Assistant:

bool PollSet::addSocket(int fd, const SocketUpdateFunc& update_func, const TransportPtr& transport)
{
  SocketInfo info;
  info.fd_ = fd;
  info.events_ = 0;
  info.transport_ = transport;
  info.func_ = update_func;

  {
    std::scoped_lock<std::mutex> lock(socket_info_mutex_);

    bool b = socket_info_.insert(std::make_pair(fd, info)).second;
    if (!b)
    {
      MINIROS_DEBUG("PollSet: Tried to add duplicate fd [%d]", fd);
      return false;
    }

    add_socket_to_watcher(epfd_, fd);

    sockets_changed_ = true;
  }

  signal();

  return true;
}